

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O1

torrent_handle __thiscall
libtorrent::session_handle::add_torrent
          (session_handle *this,add_torrent_params *params,error_code *ec)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  error_category *peVar1;
  torrent_info *ptVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  undefined4 *in_RCX;
  torrent_handle tVar5;
  reference_wrapper<boost::system::error_code> ecr;
  undefined1 local_39;
  torrent_info *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  bVar4 = digest32<160L>::is_all_zeros((digest32<160L> *)&ec[0x12].failed_);
  if (bVar4) {
    bVar4 = digest32<256L>::is_all_zeros((digest32<256L> *)&ec[0x13].cat_);
    if ((bVar4) && (ec->cat_ == (error_category *)0x0)) {
      *(int *)&ec[0x13].failed_ = ec[0x12].val_;
      peVar1 = ec[0x11].cat_;
      *(undefined8 *)&ec[0x12].failed_ = *(undefined8 *)(ec + 0x11);
      *(error_category **)((long)&ec[0x12].cat_ + 4) = peVar1;
    }
  }
  if ((torrent_info *)ec->cat_ != (torrent_info *)0x0) {
    local_38 = (torrent_info *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libtorrent::torrent_info,std::allocator<libtorrent::torrent_info>,libtorrent::torrent_info&>
              (&_Stack_30,&local_38,(allocator<libtorrent::torrent_info> *)&local_39,
               (torrent_info *)ec->cat_);
    _Var3._M_pi = _Stack_30._M_pi;
    ptVar2 = local_38;
    local_38 = (torrent_info *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(ec + 1);
    ec->cat_ = (error_category *)ptVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(ec + 1) = _Var3._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  *in_RCX = 0;
  *(undefined1 *)(in_RCX + 1) = 0;
  *(system_error_category **)(in_RCX + 2) =
       &boost::system::detail::cat_holder<void>::system_category_instance;
  tVar5 = sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params,std::reference_wrapper<boost::system::error_code>&>
                    (this,(offset_in_session_impl_to_subr)params,
                     (add_torrent_params *)aux::session_impl::add_torrent,
                     (reference_wrapper<boost::system::error_code> *)0x0);
  tVar5.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (torrent_handle)
         tVar5.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

torrent_handle session_handle::add_torrent(add_torrent_params&& params, error_code& ec)
	{
		TORRENT_ASSERT_PRECOND(!params.save_path.empty());

#if TORRENT_ABI_VERSION < 3
		if (!params.info_hashes.has_v1() && !params.info_hashes.has_v2() && !params.ti)
			params.info_hashes.v1 = params.info_hash;
#endif

		// the internal torrent object keeps and mutates state in the
		// torrent_info object. We can't let that leak back to the client
		if (params.ti)
			params.ti = std::make_shared<torrent_info>(*params.ti);

		ec.clear();
#if TORRENT_ABI_VERSION == 1
		handle_backwards_compatible_resume_data(params);
#endif
		auto ecr = std::ref(ec);
		return sync_call_ret<torrent_handle>(&session_impl::add_torrent, std::move(params), ecr);
	}